

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O3

void __thiscall
spoa::test::SpoaAlignmentTest_TypeError_Test::TestBody(SpoaAlignmentTest_TypeError_Test *this)

{
  pointer *__ptr;
  AlignmentEngine local_28;
  
  AlignmentEngine::Create(&local_28,4,'\x01',-1,-1);
  if (local_28._vptr_AlignmentEngine != (_func_int **)0x0) {
    (**(code **)(*local_28._vptr_AlignmentEngine + 8))();
  }
  return;
}

Assistant:

TEST(SpoaAlignmentTest, TypeError) {
  try {
    auto ae = AlignmentEngine::Create(static_cast<AlignmentType>(4), 1, -1, -1);
  } catch(std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[spoa::AlignmentEngine::Create] error: invalid alignment type!");
  }
}